

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_test.cc
# Opt level: O1

void re2::RE2FullMatchBraces(void)

{
  bool bVar1;
  StringPiece local_198;
  LogMessage local_188;
  
  RE2::RE2((RE2 *)&local_188,"[0-9a-f+.-]{5,}");
  local_198.ptr_ = "0abcd";
  local_198.length_ = 5;
  bVar1 = RE2::FullMatchN(&local_198,(RE2 *)&local_188,(Arg **)0x0,0);
  RE2::~RE2((RE2 *)&local_188);
  if (!bVar1) {
    LogMessage::LogMessage
              (&local_188,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x398,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_188.str_,
               "Check failed: RE2::FullMatch(\"0abcd\", \"[0-9a-f+.-]{5,}\")",0x38);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_188);
  }
  RE2::RE2((RE2 *)&local_188,"[0-9a-f+.-]{5,}");
  local_198.ptr_ = "0abcde";
  local_198.length_ = 6;
  bVar1 = RE2::FullMatchN(&local_198,(RE2 *)&local_188,(Arg **)0x0,0);
  RE2::~RE2((RE2 *)&local_188);
  if (!bVar1) {
    LogMessage::LogMessage
              (&local_188,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x399,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_188.str_,
               "Check failed: RE2::FullMatch(\"0abcde\", \"[0-9a-f+.-]{5,}\")",0x39);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_188);
  }
  RE2::RE2((RE2 *)&local_188,"[0-9a-f+.-]{5,}");
  local_198.ptr_ = "0abc";
  local_198.length_ = 4;
  bVar1 = RE2::FullMatchN(&local_198,(RE2 *)&local_188,(Arg **)0x0,0);
  RE2::~RE2((RE2 *)&local_188);
  if (bVar1) {
    LogMessage::LogMessage
              (&local_188,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x39a,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_188.str_,
               "Check failed: !RE2::FullMatch(\"0abc\", \"[0-9a-f+.-]{5,}\")",0x38);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_188);
  }
  return;
}

Assistant:

TEST(RE2, FullMatchBraces) {
  // Braces
  CHECK(RE2::FullMatch("0abcd",  "[0-9a-f+.-]{5,}"));
  CHECK(RE2::FullMatch("0abcde", "[0-9a-f+.-]{5,}"));
  CHECK(!RE2::FullMatch("0abc",  "[0-9a-f+.-]{5,}"));
}